

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_xmlns(lyout *out,lys_module *module)

{
  uint local_20;
  uint local_1c;
  uint lvl;
  uint i;
  lys_module *module_local;
  lyout *out_local;
  
  if ((*(ushort *)&module->field_0x40 & 1) == 0) {
    local_20 = 8;
  }
  else {
    local_20 = 0xb;
  }
  ly_print(out,"%*sxmlns=\"%s\"",(ulong)local_20,"","urn:ietf:params:xml:ns:yang:yin:1");
  if ((*(ushort *)&module->field_0x40 & 1) == 0) {
    ly_print(out,"\n%*sxmlns:%s=\"%s\"",(ulong)local_20,"",module->prefix,module->ns);
  }
  else {
    ly_print(out,"\n%*sxmlns:%s=\"%s\"",(ulong)local_20,"",module->prefix,module->data[1].parent);
  }
  for (local_1c = 0; local_1c < module->imp_size; local_1c = local_1c + 1) {
    ly_print(out,"\n%*sxmlns:%s=\"%s\"",(ulong)local_20,"",module->imp[local_1c].prefix,
             (module->imp[local_1c].module)->ns);
  }
  return;
}

Assistant:

static void
yin_print_xmlns(struct lyout *out, const struct lys_module *module)
{
    unsigned int i, lvl;

    if (module->type) {
        lvl = 11;
    } else {
        lvl = 8;
    }

    ly_print(out, "%*sxmlns=\"%s\"", lvl, INDENT, LY_NSYIN);
    if (!module->type) {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->prefix, module->ns);
    } else {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->prefix, ((struct lys_submodule*)module)->belongsto->ns);
    }
    for (i = 0; i < module->imp_size; ++i) {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->imp[i].prefix, module->imp[i].module->ns);
    }
}